

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::MixTest::MixTest
          (MixTest *this,Context *context,FboConfig *config,bool npot)

{
  long *plVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLenum GVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long *local_88;
  long local_78;
  undefined8 uStack_70;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar6 = "mix_";
  if ((int)CONCAT71(in_register_00000009,npot) != 0) {
    pcVar6 = "mix_npot_";
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar6,
             pcVar6 + (CONCAT71(in_register_00000009,npot) & 0xffffffff) * 5 + 4);
  FboConfig::getName_abi_cxx11_(&local_68,config);
  uVar7 = 0xf;
  if (local_48 != local_38) {
    uVar7 = local_38[0];
  }
  if (uVar7 < local_68._M_string_length + local_40) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar8 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_40 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00fdb2bd;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
LAB_00fdb2bd:
  local_88 = &local_78;
  plVar1 = puVar5 + 2;
  if ((long *)*puVar5 == plVar1) {
    local_78 = *plVar1;
    uStack_70 = puVar5[3];
  }
  else {
    local_78 = *plVar1;
    local_88 = (long *)*puVar5;
  }
  *puVar5 = plVar1;
  puVar5[1] = 0;
  *(undefined1 *)plVar1 = 0;
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,(char *)local_88,
             "Use two fbos as sources in draw operation");
  (this->super_FboRenderCase).super_TestCase.m_context = context;
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02128878;
  GVar2 = config->stencilbufferFormat;
  (this->super_FboRenderCase).m_config.stencilbufferType = config->stencilbufferType;
  (this->super_FboRenderCase).m_config.stencilbufferFormat = GVar2;
  GVar2 = config->colorbufferFormat;
  GVar3 = config->depthbufferType;
  GVar4 = config->depthbufferFormat;
  (this->super_FboRenderCase).m_config.colorbufferType = config->colorbufferType;
  (this->super_FboRenderCase).m_config.colorbufferFormat = GVar2;
  (this->super_FboRenderCase).m_config.depthbufferType = GVar3;
  (this->super_FboRenderCase).m_config.depthbufferFormat = GVar4;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02128938;
  uVar12 = (uint)npot;
  uVar9 = (int)(uVar12 << 0x1f) >> 0x1f;
  uVar10 = (int)(uVar12 << 0x1f) >> 0x1f;
  uVar11 = (int)(uVar12 << 0x1f) >> 0x1f;
  uVar12 = (int)(uVar12 << 0x1f) >> 0x1f;
  this->m_fboAWidth = uVar9 & 0x7f | ~uVar9 & 0x80;
  this->m_fboAHeight = uVar10 & 0x5f | ~uVar10 & 0x80;
  this->m_fboBWidth = uVar11 & 0x37 | ~uVar11 & 0x40;
  this->m_fboBHeight = uVar12 & 0x3f | ~uVar12 & 0x40;
  return;
}

Assistant:

MixTest::MixTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "mix_npot_" : "mix_") + config.getName()).c_str(), "Use two fbos as sources in draw operation", config)
	, m_fboAWidth	(npot ? 127 : 128)
	, m_fboAHeight	(npot ?  95 : 128)
	, m_fboBWidth	(npot ?  55 :  64)
	, m_fboBHeight	(npot ?  63 :  64)
{
}